

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_dofile(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  long in_RDI;
  GCstr *fname;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  lua_State *L_00;
  undefined8 in_stack_ffffffffffffffe8;
  lua_State *in_stack_fffffffffffffff0;
  
  pGVar2 = lj_lib_optstr(in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 4) = 0xffffffff;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + 8;
  if (pGVar2 == (GCstr *)0x0) {
    L_00 = (lua_State *)0x0;
  }
  else {
    L_00 = (lua_State *)(pGVar2 + 1);
  }
  iVar1 = luaL_loadfile(L_00,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (iVar1 != 0) {
    lua_error((lua_State *)0x186c9c);
  }
  lua_call(L_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return (int)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) >> 3) + -1;
}

Assistant:

LJLIB_CF(dofile)
{
  GCstr *fname = lj_lib_optstr(L, 1);
  setnilV(L->top);
  L->top = L->base+1;
  if (luaL_loadfile(L, fname ? strdata(fname) : NULL) != 0)
    lua_error(L);
  lua_call(L, 0, LUA_MULTRET);
  return (int)(L->top - L->base) - 1;
}